

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O3

int Aig_NodeRefLabel_rec(Aig_Man_t *p,Aig_Obj_t *pNode,uint LevelMin)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  
  if ((*(uint *)&pNode->field_0x18 & 7) == 2) {
    return 0;
  }
  pNode->TravId = p->nTravIds;
  pAVar5 = (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe);
  uVar1 = *(ulong *)&pAVar5->field_0x18;
  *(ulong *)&pAVar5->field_0x18 =
       uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
  if ((uVar1 & 0xffffffc0) == 0) {
    if (LevelMin == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = LevelMin;
      if (((uint)(uVar1 >> 0x20) & 0xffffff) <= LevelMin) goto LAB_00634ca5;
    }
    iVar4 = Aig_NodeRefLabel_rec(p,pAVar5,uVar2);
  }
  else {
LAB_00634ca5:
    iVar4 = 0;
  }
  uVar2 = (uint)*(undefined8 *)&pNode->field_0x18;
  if ((uVar2 & 7) == 4) {
    return iVar4;
  }
  if ((uVar2 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigMffc.c"
                  ,0x83,"int Aig_NodeRefLabel_rec(Aig_Man_t *, Aig_Obj_t *, unsigned int)");
  }
  pAVar5 = (Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
  uVar1 = *(ulong *)&pAVar5->field_0x18;
  *(ulong *)&pAVar5->field_0x18 =
       uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
  if ((uVar1 & 0xffffffc0) == 0) {
    if (LevelMin == 0) {
      LevelMin = 0;
    }
    else if (((uint)(uVar1 >> 0x20) & 0xffffff) <= LevelMin) goto LAB_00634d27;
    iVar3 = Aig_NodeRefLabel_rec(p,pAVar5,LevelMin);
    iVar4 = iVar4 + iVar3;
  }
LAB_00634d27:
  return iVar4 + 1;
}

Assistant:

int Aig_NodeRefLabel_rec( Aig_Man_t * p, Aig_Obj_t * pNode, unsigned LevelMin )
{
    Aig_Obj_t * pFanin;
    int Counter = 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pNode );
    // consider the first fanin
    pFanin = Aig_ObjFanin0(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRefLabel_rec( p, pFanin, LevelMin );
    if ( Aig_ObjIsBuf(pNode) )
        return Counter;
    assert( Aig_ObjIsNode(pNode) );
    // consider the second fanin
    pFanin = Aig_ObjFanin1(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRefLabel_rec( p, pFanin, LevelMin );
    return Counter + 1;
}